

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O0

ToolOptions * __thiscall
wasm::ToolOptions::addFeature
          (ToolOptions *this,Feature feature,string *description,FeatureSet impliedEnable,
          FeatureSet impliedDisable)

{
  string *psVar1;
  Feature f;
  Feature f_00;
  anon_class_16_3_70c25969 local_298;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_288;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator<char> local_1f1;
  string local_1f0 [32];
  string local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  anon_class_16_3_fcd813fc local_168;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_158;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *description_local;
  ToolOptions *pTStack_18;
  Feature feature_local;
  ToolOptions *this_local;
  FeatureSet impliedDisable_local;
  FeatureSet impliedEnable_local;
  
  local_28 = description;
  description_local._4_4_ = feature;
  pTStack_18 = this;
  this_local._0_4_ = impliedDisable.features;
  this_local._4_4_ = impliedEnable.features;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"--enable-",&local_69);
  FeatureSet::toString_abi_cxx11_(&local_a0,(FeatureSet *)(ulong)description_local._4_4_,f);
  std::operator+(&local_48,&local_68,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Enable ",&local_109);
  std::operator+(&local_e8,&local_108,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"Tool options",&local_131);
  local_168.feature = description_local._4_4_;
  local_168.impliedEnable.features = this_local._4_4_;
  local_168.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::addFeature(wasm::FeatureSet::Feature,std::__cxx11::string_const&,wasm::FeatureSet,wasm::FeatureSet)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_158,&local_168);
  psVar1 = (string *)
           wasm::Options::add((string *)&this->super_Options,(string *)&local_48,local_c0,
                              (string *)&local_e8,(Arguments)local_130,(function *)0x0,
                              SUB81(&local_158,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"--disable-",&local_1a9);
  FeatureSet::toString_abi_cxx11_(&local_1d0,(FeatureSet *)(ulong)description_local._4_4_,f_00);
  std::operator+(&local_188,&local_1a8,&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Disable ",&local_239);
  std::operator+(&local_218,&local_238,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"Tool options",&local_261);
  local_298.feature = description_local._4_4_;
  local_298.impliedDisable.features = this_local._0_4_;
  local_298.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::addFeature(wasm::FeatureSet::Feature,std::__cxx11::string_const&,wasm::FeatureSet,wasm::FeatureSet)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_288,&local_298);
  wasm::Options::add(psVar1,(string *)&local_188,local_1f0,(string *)&local_218,(Arguments)local_260
                     ,(function *)0x0,SUB81(&local_288,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_288);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return this;
}

Assistant:

ToolOptions& addFeature(FeatureSet::Feature feature,
                          const std::string& description,
                          FeatureSet impliedEnable = FeatureSet::None,
                          FeatureSet impliedDisable = FeatureSet::None) {
    (*this)
      .add(std::string("--enable-") + FeatureSet::toString(feature),
           "",
           std::string("Enable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedEnable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedEnable, true);
             disabledFeatures.set(feature | impliedEnable, false);
           })

      .add(std::string("--disable-") + FeatureSet::toString(feature),
           "",
           std::string("Disable ") + description,
           ToolOptionsCategory,
           Arguments::Zero,
           [this, feature, impliedDisable](Options*, const std::string&) {
             enabledFeatures.set(feature | impliedDisable, false);
             disabledFeatures.set(feature | impliedDisable, true);
           });
    return *this;
  }